

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentMap.cpp
# Opt level: O0

void __thiscall EnvironmentMap::Reset(EnvironmentMap *this)

{
  shared_ptr<myvk::Image> *in_RDI;
  shared_ptr<myvk::Image> *in_stack_ffffffffffffffa8;
  
  std::shared_ptr<myvk::Image>::shared_ptr(in_RDI,in_stack_ffffffffffffffa8);
  std::shared_ptr<myvk::Image>::operator=(in_RDI,in_stack_ffffffffffffffa8);
  std::shared_ptr<myvk::Image>::~shared_ptr((shared_ptr<myvk::Image> *)0x1688ae);
  std::shared_ptr<myvk::ImageView>::shared_ptr
            ((shared_ptr<myvk::ImageView> *)in_RDI,in_stack_ffffffffffffffa8);
  std::shared_ptr<myvk::ImageView>::operator=
            ((shared_ptr<myvk::ImageView> *)in_RDI,
             (shared_ptr<myvk::ImageView> *)in_stack_ffffffffffffffa8);
  std::shared_ptr<myvk::ImageView>::~shared_ptr((shared_ptr<myvk::ImageView> *)0x1688d9);
  std::shared_ptr<myvk::Image>::shared_ptr(in_RDI,in_stack_ffffffffffffffa8);
  std::shared_ptr<myvk::Image>::operator=(in_RDI,in_stack_ffffffffffffffa8);
  std::shared_ptr<myvk::Image>::~shared_ptr((shared_ptr<myvk::Image> *)0x168904);
  std::shared_ptr<myvk::ImageView>::shared_ptr
            ((shared_ptr<myvk::ImageView> *)in_RDI,in_stack_ffffffffffffffa8);
  std::shared_ptr<myvk::ImageView>::operator=
            ((shared_ptr<myvk::ImageView> *)in_RDI,
             (shared_ptr<myvk::ImageView> *)in_stack_ffffffffffffffa8);
  std::shared_ptr<myvk::ImageView>::~shared_ptr((shared_ptr<myvk::ImageView> *)0x16892f);
  return;
}

Assistant:

void EnvironmentMap::Reset() {
	m_hdr_image = nullptr;
	m_hdr_image_view = nullptr;
	m_alias_table_image = nullptr;
	m_alias_table_image_view = nullptr;
}